

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_asInt64
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  long value;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    value = (long)*(double *)(uVar1 + 0x10);
  }
  else {
    value = 0;
  }
  if (value + 0x800000000000000U >> 0x3c == 0) {
    return value << 4 | 0xc;
  }
  sVar2 = sysbvm_tuple_int64_encodeBig(context,value);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asInt64(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_int64_encode(context, (int64_t)sysbvm_tuple_float64_decode(arguments[0]));
}